

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O1

int do_sysclktz(int nargs,char **args)

{
  int iVar1;
  timezone tz;
  timezone local_18;
  
  iVar1 = -1;
  if (nargs == 2) {
    local_18.tz_minuteswest = 0;
    local_18.tz_dsttime = 0;
    iVar1 = atoi(args[1]);
    local_18.tz_minuteswest = iVar1;
    iVar1 = settimeofday((timeval *)0x0,&local_18);
    iVar1 = -(uint)(iVar1 != 0);
  }
  return iVar1;
}

Assistant:

int do_sysclktz(int nargs, char **args)
{
    struct timezone tz;

    if (nargs != 2)
        return -1;

    memset(&tz, 0, sizeof(tz));
    tz.tz_minuteswest = atoi(args[1]);   
    if (settimeofday(NULL, &tz))
        return -1;
    return 0;
}